

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastSR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  undefined8 *puVar4;
  SerialArena *this;
  __int_type_conflict _Var5;
  __pointer_type pSVar6;
  char cVar7;
  long lVar8;
  Rep *pRVar9;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar10;
  string *psVar11;
  string *s;
  char *pcVar12;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar13;
  uint uVar14;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this_00;
  ulong uVar15;
  ushort *ptr_00;
  ulong uVar16;
  uint *puVar17;
  pair<const_char_*,_int> pVar18;
  LogMessageFatal local_40 [16];
  
  if (data.field_0._0_2_ != 0) {
    pcVar12 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar12;
  }
  this_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
            ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this_00 & 7) != 0) {
    AlignFail(this_00);
  }
  uVar2 = *(ushort *)ptr;
  puVar4 = (undefined8 *)this_00[2].data;
  if (puVar4 == (undefined8 *)0x0) {
LAB_001547d1:
    do {
      ptr_00 = (ushort *)((long)ptr + 2);
      s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this_00);
      ptr = InlineGreedyStringParser(s,(char *)ptr_00,ctx);
      ctx_00 = extraout_RDX_00;
      if ((ushort *)ptr == (ushort *)0x0) goto LAB_001548d9;
      pVVar10 = RepeatedPtrFieldBase::
                Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
      cVar7 = utf8_range::IsStructurallyValid(pVVar10->_M_string_length,(pVVar10->_M_dataplus)._M_p)
      ;
      if (cVar7 == '\0') {
        ReportFastUtf8Error((int)(char)uVar2 + (uint)uVar2 >> 1,table);
      }
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (ctx->super_EpsCopyInputStream).limit_end_;
      if ((ulong)data.field_0 <= ptr) goto LAB_001548c5;
      uVar3 = *(ushort *)ptr;
    } while (uVar3 == uVar2);
  }
  else {
    lVar8 = __tls_get_addr(&PTR_001b3f20);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(lVar8 + 8))->data;
    if (data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)*puVar4) goto LAB_001547d1;
    this = *(SerialArena **)(lVar8 + 0x10);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this_00->data;
    if (((ulong)data.field_0 & 1) == 0) {
      uVar14 = (uint)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0);
    }
    else {
      pRVar9 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
      uVar14 = pRVar9->allocated_size;
    }
    if (uVar14 != *(uint *)(this_00 + 1)) goto LAB_001547d1;
    aVar13._0_4_ = (int)(char)uVar2 + (uint)uVar2 >> 1;
    aVar13.data._4_4_ = 0;
    data.field_0 = aVar13;
    do {
      bVar1 = (byte)*(ushort *)((long)ptr + 2);
      ptr_00 = (ushort *)(ulong)bVar1;
      uVar14 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        pVar18 = ReadSizeFallback((char *)((long)ptr + 2),(uint)bVar1);
        ctx_00 = pVar18._8_8_;
        if ((ushort *)pVar18.first == (ushort *)0x0) {
LAB_001548d9:
          pcVar12 = Error(msg,(char *)ptr_00,ctx_00,data,table,hasbits);
          return pcVar12;
        }
        uVar14 = pVar18.second;
        ptr_00 = (ushort *)pVar18.first;
      }
      else {
        ptr_00 = (ushort *)((long)ptr + 3);
      }
      _Var5 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
      if (_Var5 == 0) {
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       SerialArena::AllocateFromStringBlockFallback(this);
      }
      else {
        uVar16 = _Var5 - 0x20;
        (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar16;
        pSVar6 = (this->string_block_)._M_b._M_p;
        uVar15 = (ulong)pSVar6->allocated_size_ - 0x10;
        if (uVar15 < uVar16) {
          psVar11 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                              (uVar16,uVar15,"offset <= effective_size()");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/string_block.h"
                     ,0xa2,*(undefined8 *)(psVar11 + 8),*(undefined8 *)psVar11);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
        }
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((long)&pSVar6[-1].next_ + _Var5);
      }
      *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
      *(undefined8 *)((long)data.field_0 + 8) = 0;
      *(undefined1 *)((long)data.field_0 + 0x10) = 0;
      RepeatedPtrFieldBase::AddAllocatedForParse
                ((RepeatedPtrFieldBase *)this_00,(void *)data.field_0);
      ptr = EpsCopyInputStream::ReadString
                      (&ctx->super_EpsCopyInputStream,(char *)ptr_00,uVar14,(string *)data.field_0);
      ctx_00 = extraout_RDX;
      if ((ushort *)ptr == (ushort *)0x0) goto LAB_001548d9;
      pVVar10 = RepeatedPtrFieldBase::
                Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
      cVar7 = utf8_range::IsStructurallyValid(pVVar10->_M_string_length,(pVVar10->_M_dataplus)._M_p)
      ;
      if (cVar7 == '\0') {
        ReportFastUtf8Error(aVar13._0_4_,table);
      }
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (ctx->super_EpsCopyInputStream).limit_end_;
      if ((ulong)data.field_0 <= ptr) goto LAB_001548c5;
      uVar3 = *(ushort *)ptr;
    } while (uVar3 == uVar2);
  }
  if (ptr < (ulong)data.field_0) {
    uVar14 = (uint)table->fast_idx_mask & (uint)uVar3;
    if ((uVar14 & 7) == 0) {
      uVar15 = (ulong)(uVar14 & 0xfffffff8);
      pcVar12 = (char *)(**(code **)(&table[1].has_bits_offset + uVar15))
                                  (msg,ptr,ctx,
                                   (ulong)(uint)uVar3 ^
                                   *(ulong *)(&table[1].fast_idx_mask + uVar15 * 2),table,hasbits);
      return pcVar12;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  uVar2 = table->has_bits_offset;
joined_r0x001548d5:
  if ((ulong)uVar2 != 0) {
    puVar17 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)uVar2);
    if (((ulong)puVar17 & 3) != 0) {
      AlignFail();
    }
    *puVar17 = *puVar17 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
LAB_001548c5:
  uVar2 = table->has_bits_offset;
  goto joined_r0x001548d5;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastSR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedString<
      uint16_t, RepeatedPtrField<std::string>, kUtf8ValidateOnly>(
      PROTOBUF_TC_PARAM_PASS);
}